

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  element_type *peVar1;
  ulong uVar2;
  ModelDescription *pMVar3;
  Metadata *pMVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  
  Model(this);
  peVar1 = (this->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    uVar2 = (peVar1->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar6);
    peVar1->description_ = pMVar3;
  }
  pMVar3 = peVar1->description_;
  if (pMVar3->metadata_ == (Metadata *)0x0) {
    uVar2 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Metadata>(pAVar6);
    pMVar3->metadata_ = pMVar4;
  }
  uVar2 = (pMVar3->metadata_->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar3->metadata_->shortdescription_,description,puVar5);
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }